

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::enum_to_stem_string::signDisplay
               (UNumberSignDisplay value,UnicodeString *sb)

{
  ConstChar16Ptr local_60;
  ConstChar16Ptr local_58;
  ConstChar16Ptr local_50;
  ConstChar16Ptr local_48;
  ConstChar16Ptr local_40;
  ConstChar16Ptr local_38 [3];
  ConstChar16Ptr local_20;
  UnicodeString *local_18;
  UnicodeString *sb_local;
  UNumberSignDisplay value_local;
  
  local_18 = sb;
  sb_local._4_4_ = value;
  switch(value) {
  case UNUM_SIGN_AUTO:
    ConstChar16Ptr::ConstChar16Ptr(&local_20,L"sign-auto");
    UnicodeString::append(sb,&local_20,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_20);
    break;
  case UNUM_SIGN_ALWAYS:
    ConstChar16Ptr::ConstChar16Ptr(local_38,L"sign-always");
    UnicodeString::append(sb,local_38,-1);
    ConstChar16Ptr::~ConstChar16Ptr(local_38);
    break;
  case UNUM_SIGN_NEVER:
    ConstChar16Ptr::ConstChar16Ptr(&local_40,L"sign-never");
    UnicodeString::append(sb,&local_40,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_40);
    break;
  case UNUM_SIGN_ACCOUNTING:
    ConstChar16Ptr::ConstChar16Ptr(&local_48,L"sign-accounting");
    UnicodeString::append(sb,&local_48,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_48);
    break;
  case UNUM_SIGN_ACCOUNTING_ALWAYS:
    ConstChar16Ptr::ConstChar16Ptr(&local_50,L"sign-accounting-always");
    UnicodeString::append(sb,&local_50,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_50);
    break;
  case UNUM_SIGN_EXCEPT_ZERO:
    ConstChar16Ptr::ConstChar16Ptr(&local_58,L"sign-except-zero");
    UnicodeString::append(sb,&local_58,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_58);
    break;
  case UNUM_SIGN_ACCOUNTING_EXCEPT_ZERO:
    ConstChar16Ptr::ConstChar16Ptr(&local_60,L"sign-accounting-except-zero");
    UnicodeString::append(sb,&local_60,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_60);
  }
  return;
}

Assistant:

void enum_to_stem_string::signDisplay(UNumberSignDisplay value, UnicodeString& sb) {
    switch (value) {
        case UNUM_SIGN_AUTO:
            sb.append(u"sign-auto", -1);
            break;
        case UNUM_SIGN_ALWAYS:
            sb.append(u"sign-always", -1);
            break;
        case UNUM_SIGN_NEVER:
            sb.append(u"sign-never", -1);
            break;
        case UNUM_SIGN_ACCOUNTING:
            sb.append(u"sign-accounting", -1);
            break;
        case UNUM_SIGN_ACCOUNTING_ALWAYS:
            sb.append(u"sign-accounting-always", -1);
            break;
        case UNUM_SIGN_EXCEPT_ZERO:
            sb.append(u"sign-except-zero", -1);
            break;
        case UNUM_SIGN_ACCOUNTING_EXCEPT_ZERO:
            sb.append(u"sign-accounting-except-zero", -1);
            break;
        default:
            U_ASSERT(false);
    }
}